

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O0

int32_t zng_gzeof(gzFile file)

{
  int32_t local_1c;
  gz_state *state;
  gzFile file_local;
  int32_t local_4;
  
  if (file == (gzFile)0x0) {
    local_4 = 0;
  }
  else if ((file[1].have == 0x1c4f) || (file[1].have == 0x79b1)) {
    if (file[1].have == 0x1c4f) {
      local_1c = *(int32_t *)((long)&file[3].next + 4);
    }
    else {
      local_1c = 0;
    }
    local_4 = local_1c;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Z_EXPORT PREFIX(gzeof)(gzFile file) {
    gz_state *state;

    /* get internal structure and check integrity */
    if (file == NULL)
        return 0;
    state = (gz_state *)file;
    if (state->mode != GZ_READ && state->mode != GZ_WRITE)
        return 0;

    /* return end-of-file state */
    return state->mode == GZ_READ ? state->past : 0;
}